

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O3

void __thiscall
duckdb::DbpEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
          (DbpEncoder *this,WriteStream *writer,ParquetUUIDTargetType *first_value)

{
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"DbpEncoder should only be used with integers","");
  duckdb::InternalException::InternalException(this_00,(string *)local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BeginWrite(WriteStream &writer, const T &first_value) {
		throw InternalException("DbpEncoder should only be used with integers");
	}